

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext.cpp
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::FuncArgsContext::markDstRegsDirty(FuncArgsContext *this,FuncFrame *frame)

{
  bool bVar1;
  RegGroup RVar2;
  RegMask RVar3;
  uint uVar4;
  WorkData *this_00;
  undefined8 in_RDI;
  uint32_t regs;
  WorkData *wd;
  RegGroup group;
  Iterator __end2;
  Iterator __begin2;
  RegGroupVirtValues *__range2;
  RegGroup *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  Iterator local_1b;
  Iterator local_1a;
  EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)3>
  local_19;
  EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)3>
  *local_18;
  
  local_18 = &local_19;
  local_1a = Support::
             EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)3>
             ::begin(local_18);
  local_1b = Support::
             EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)3>
             ::end(local_18);
  while( true ) {
    bVar1 = Support::
            EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)3>
            ::Iterator::operator!=(&local_1a,&local_1b);
    if (!bVar1) break;
    RVar2 = Support::
            EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)3>
            ::Iterator::operator*(&local_1a);
    this_00 = Support::Array<asmjit::_abi_1_10::FuncArgsContext::WorkData,_4UL>::
              operator[]<asmjit::_abi_1_10::RegGroup>
                        ((Array<asmjit::_abi_1_10::FuncArgsContext::WorkData,_4UL> *)
                         CONCAT17(RVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
    RVar3 = WorkData::usedRegs(this_00);
    uVar4 = RVar3 | this_00->_dstShuf;
    this_00->_workRegs = uVar4 | this_00->_workRegs;
    FuncFrame::addDirtyRegs
              ((FuncFrame *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),
               (RegGroup)((ulong)in_RDI >> 0x38),(RegMask)in_RDI);
    Support::
    EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)3>
    ::Iterator::operator++(&local_1a);
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncArgsContext::markDstRegsDirty(FuncFrame& frame) noexcept {
  for (RegGroup group : RegGroupVirtValues{}) {
    WorkData& wd = _workData[group];
    uint32_t regs = wd.usedRegs() | wd._dstShuf;

    wd._workRegs |= regs;
    frame.addDirtyRegs(group, regs);
  }

  return kErrorOk;
}